

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O1

void screen_byte_1(ubyte iobyte,uint address)

{
  ushort uVar1;
  ubyte uVar2;
  byte bVar3;
  uint uVar4;
  ushort uVar5;
  uint i1;
  uint uVar6;
  ushort i;
  int iVar7;
  uint i_00;
  uint uVar8;
  
  uVar2 = crt_regs[1];
  uVar4 = (ushort)(address - ram_screen_start) ^ 0xffff8000;
  if (screen_start <= address) {
    uVar4 = (uint)address;
  }
  uVar4 = uVar4 - screen_start;
  uVar8 = (uVar4 & 7) + ((uVar4 & 0xffff) / ((uint)crt_regs[1] * 8) & 0x1fff) * 8;
  uVar6 = (short)(uVar8 >> 2) + (short)uVar8;
  uVar5 = (ushort)((uVar4 & 0xffff) % ((uint)crt_regs[1] * 8));
  if (crt_regs[1] == 'P') {
    i = uVar5 & 0x3f8;
    putpixel(i,uVar6,(uint)(iobyte >> 4 & 8));
    uVar1 = uVar5 & 0x3f8;
    putpixel(uVar1 + 1,uVar6,iobyte >> 3 & 8);
    putpixel(uVar1 + 2,uVar6,iobyte >> 2 & 8);
    putpixel(uVar1 + 3,uVar6,iobyte >> 1 & 8);
    uVar8 = (uint)iobyte;
    putpixel(uVar1 + 4,uVar6,uVar8 & 8);
    putpixel(uVar1 + 5,uVar6,iobyte + uVar8 & 8);
    putpixel(uVar1 | 6,uVar6,uVar8 * 4 & 8);
    uVar5 = uVar5 | 7;
    iVar7 = (iobyte & 1) << 3;
  }
  else {
    i = uVar5 * 2 & 0xff0;
    bVar3 = iobyte >> 4 & 8;
    putpixel(i,uVar6,(uint)bVar3);
    putpixel(i + 1,uVar6,(uint)bVar3);
    uVar8 = iobyte >> 3 & 8;
    putpixel(i + 2,uVar6,uVar8);
    putpixel(i + 3,uVar6,uVar8);
    uVar8 = iobyte >> 2 & 8;
    putpixel(i + 4,uVar6,uVar8);
    putpixel(i + 5,uVar6,uVar8);
    uVar8 = iobyte >> 1 & 8;
    putpixel(i + 6,uVar6,uVar8);
    putpixel(i + 7,uVar6,uVar8);
    uVar8 = (uint)iobyte;
    putpixel(i + 8,uVar6,uVar8 & 8);
    putpixel(i + 9,uVar6,uVar8 & 8);
    i1 = iobyte + uVar8 & 8;
    putpixel(i + 10,uVar6,i1);
    putpixel(i + 0xb,uVar6,i1);
    uVar8 = uVar8 * 4 & 8;
    putpixel(i + 0xc,uVar6,uVar8);
    putpixel(i + 0xd,uVar6,uVar8);
    iVar7 = (iobyte & 1) << 3;
    putpixel(i + 0xe,uVar6,iVar7);
    uVar5 = i | 0xf;
  }
  putpixel(uVar5,uVar6,iVar7);
  if ((uVar4 & 3) != 0) {
    return;
  }
  uVar6 = uVar6 - 1;
  bVar3 = iobyte >> 4 & 8;
  putpixel(i,uVar6,(uint)bVar3);
  uVar4 = (uint)iobyte;
  if (uVar2 == 'P') {
    putpixel(i | 1,uVar6,iobyte >> 3 & 8);
    putpixel(i | 2,uVar6,iobyte >> 2 & 8);
    putpixel(i | 3,uVar6,iobyte >> 1 & 8);
    putpixel(i | 4,uVar6,uVar4 & 8);
    putpixel(i | 5,uVar6,uVar4 * 2 & 8);
    putpixel(i | 6,uVar6,uVar4 * 4 & 8);
    i_00 = i | 7;
    iVar7 = (uVar4 & 1) << 3;
  }
  else {
    putpixel(i | 1,uVar6,(uint)bVar3);
    uVar8 = iobyte >> 3 & 8;
    putpixel(i | 2,uVar6,uVar8);
    putpixel(i | 3,uVar6,uVar8);
    uVar8 = iobyte >> 2 & 8;
    putpixel(i | 4,uVar6,uVar8);
    putpixel(i | 5,uVar6,uVar8);
    uVar8 = iobyte >> 1 & 8;
    putpixel(i | 6,uVar6,uVar8);
    putpixel(i | 7,uVar6,uVar8);
    putpixel(i + 8,uVar6,uVar4 & 8);
    putpixel(i + 9,uVar6,uVar4 & 8);
    uVar8 = uVar4 * 2 & 8;
    putpixel(i + 10,uVar6,uVar8);
    putpixel(i + 0xb,uVar6,uVar8);
    uVar8 = uVar4 * 4 & 8;
    putpixel(i + 0xc,uVar6,uVar8);
    putpixel(i + 0xd,uVar6,uVar8);
    iVar7 = (uVar4 & 1) << 3;
    putpixel(i + 0xe,uVar6,iVar7);
    i_00 = i + 0xf;
  }
  putpixel(i_00,uVar6,iVar7);
  return;
}

Assistant:

void screen_byte_1(ubyte iobyte, uint address) {
    uint x_cord = 0;                 // init real x cordinate variable
    uint y_cord = 0;                 // init real y cordinate variable
    uint virt_y_cord = 0;            // init actual pc output y coordinate
    uint bitsperline;              // variable holding bits per line

    // deal with hardware wrap-around
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;
    bitsperline = crt_regs[1] << 3;    // calculate bits per line

    y_cord = address / (bitsperline);  // calculate character row of address
    y_cord *= 8;                     // convert to pixel row
    y_cord += (address % 8);           // add fraction of character to pixel row

    virt_y_cord += y_cord + y_cord / 4;  // scale output to pc screen

    x_cord = address % (bitsperline);  // calculate x coordinate
    x_cord &= 0xFFF8;                // mask off lower 3 bits

    if (bitsperline == 640)          // if an 80 character mode
    {
        putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
    }

    else                           // if not an 80 character mode
    {
        x_cord <<= 1;                    // scale output to fit pc screen
        putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 8, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 9, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 10, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 11, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 12, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 13, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 14, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        putpixel(x_cord + 15, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
    }


    if (!(y_cord & 3))               // if the vertical coordinate has been scaled
    {
        virt_y_cord--;                 // file in the extra pixels

        if (bitsperline == 640)          // if an 80 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        }

        else                           // if not an 80 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 8, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 9, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 10, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 11, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 12, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 13, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 14, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
            putpixel(x_cord + 15, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        }

    }

}